

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DIP.cpp
# Opt level: O0

void __thiscall Car::Car(Car *this,shared_ptr<Engine> *engine,shared_ptr<ILogger> *logg)

{
  element_type *peVar1;
  allocator<char> local_41;
  string local_40 [32];
  shared_ptr<ILogger> *local_20;
  shared_ptr<ILogger> *logg_local;
  shared_ptr<Engine> *engine_local;
  Car *this_local;
  
  local_20 = logg;
  logg_local = (shared_ptr<ILogger> *)engine;
  engine_local = &this->engine;
  std::shared_ptr<Engine>::shared_ptr(&this->engine,engine);
  std::shared_ptr<ILogger>::shared_ptr(&this->logger,logg);
  peVar1 = std::__shared_ptr_access<ILogger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ILogger,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->logger);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"car is created",&local_41);
  (*peVar1->_vptr_ILogger[2])(peVar1,local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  return;
}

Assistant:

explicit Car(std::shared_ptr<Engine> engine, std::shared_ptr<ILogger> logg)
		:	engine(std::move(engine)),
			logger(std::move(logg))
	{
		logger->log("car is created");
	}